

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ITxSender_testfile.cpp
# Opt level: O1

ssize_t __thiscall
ITxSender_testfile::send(ITxSender_testfile *this,int __fd,void *__buf,size_t __n,int __flags)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  ssize_t sVar4;
  ostream *poVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  undefined4 in_register_00000034;
  char *pcVar9;
  ofstream *poVar10;
  
  sVar4 = std::__basic_file<char>::is_open();
  if ((char)sVar4 != '\0') {
    poVar10 = &this->m_file;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"pulse 3400",10);
    cVar3 = (char)poVar10;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"space 1725",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar2 = (char *)((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
    for (pcVar8 = *(char **)CONCAT44(in_register_00000034,__fd); pcVar8 != pcVar2;
        pcVar8 = pcVar8 + 1) {
      cVar1 = *pcVar8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"pulse 470",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + cVar3);
      std::ostream::put(cVar3);
      poVar5 = (ostream *)std::ostream::flush();
      if (cVar1 == '\0') {
        lVar7 = 9;
        pcVar9 = "space 400";
      }
      else {
        lVar7 = 10;
        pcVar9 = "space 1200";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"timeout 13400",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"pulse 3400",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"space 1725",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar2 = *(char **)((long)__buf + 8);
    for (pcVar8 = *__buf; pcVar8 != pcVar2; pcVar8 = pcVar8 + 1) {
      cVar1 = *pcVar8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"pulse 470",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + cVar3);
      std::ostream::put(cVar3);
      poVar5 = (ostream *)std::ostream::flush();
      if (cVar1 == '\0') {
        lVar7 = 9;
        pcVar9 = "space 400";
      }
      else {
        lVar7 = 10;
        pcVar9 = "space 1200";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"pulse 470",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    uVar6 = std::ostream::flush();
    sVar4 = CONCAT71((int7)((ulong)uVar6 >> 8),(char)sVar4);
  }
  return sVar4;
}

Assistant:

bool ITxSender_testfile::send(const std::vector<uint8_t> &signalHeader
	, const std::vector<uint8_t> &signal)
{
	if (!m_file.is_open()) {
		return false;
	}

	// Start bit.
	m_file << "pulse 3400" << std::endl << "space 1725" << std::endl;

	// Header
	for (auto bit : signalHeader) {
		if (bit) {
			m_file << "pulse 470" << std::endl << "space 1200" << std::endl;
		} else {
			m_file << "pulse 470" << std::endl << "space 400" << std::endl;
		}
	}

	m_file << "timeout 13400" << std::endl;

	// Start bit.
	m_file << "pulse 3400" << std::endl << "space 1725" << std::endl;

	// Message
	for (auto bit : signal) {
		if (bit) {
			m_file << "pulse 470" << std::endl << "space 1200" << std::endl;
		}
		else {
			m_file << "pulse 470" << std::endl << "space 400" << std::endl;
		}
	}

	// End pulse
	m_file << "pulse 470" << std::endl;
	return true;
}